

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcparam.c
# Opt level: O3

jpeg_scan_info * fill_dc_scans(jpeg_scan_info *scanptr,int ncomps,int Ah,int Al)

{
  undefined1 auVar1 [16];
  int iVar2;
  long lVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  
  if (ncomps < 5) {
    scanptr->comps_in_scan = ncomps;
    auVar1 = _DAT_00158050;
    if (0 < ncomps) {
      lVar3 = (ulong)(uint)ncomps - 1;
      auVar5._8_4_ = (int)lVar3;
      auVar5._0_8_ = lVar3;
      auVar5._12_4_ = (int)((ulong)lVar3 >> 0x20);
      uVar4 = 0;
      auVar5 = auVar5 ^ _DAT_00158050;
      auVar6 = _DAT_00158000;
      do {
        auVar7 = auVar6 ^ auVar1;
        if ((bool)(~(auVar7._4_4_ == auVar5._4_4_ && auVar5._0_4_ < auVar7._0_4_ ||
                    auVar5._4_4_ < auVar7._4_4_) & 1)) {
          scanptr->component_index[uVar4] = (int)uVar4;
        }
        if ((auVar7._12_4_ != auVar5._12_4_ || auVar7._8_4_ <= auVar5._8_4_) &&
            auVar7._12_4_ <= auVar5._12_4_) {
          scanptr->component_index[uVar4 + 1] = (int)uVar4 + 1;
        }
        uVar4 = uVar4 + 2;
        lVar3 = auVar6._8_8_;
        auVar6._0_8_ = auVar6._0_8_ + 2;
        auVar6._8_8_ = lVar3 + 2;
      } while ((ncomps + 1U & 0xfffffffe) != uVar4);
    }
    scanptr->Ss = 0;
    scanptr->Se = 0;
    scanptr->Ah = Ah;
    scanptr->Al = Al;
    return scanptr + 1;
  }
  iVar2 = 0;
  do {
    scanptr->comps_in_scan = 1;
    scanptr->component_index[0] = iVar2;
    scanptr->Ss = 0;
    scanptr->Se = 0;
    scanptr->Ah = Ah;
    scanptr->Al = Al;
    scanptr = scanptr + 1;
    iVar2 = iVar2 + 1;
  } while (ncomps != iVar2);
  return scanptr;
}

Assistant:

LOCAL(jpeg_scan_info *)
fill_dc_scans(jpeg_scan_info *scanptr, int ncomps, int Ah, int Al)
/* Support routine: generate interleaved DC scan if possible, else N scans */
{
  int ci;

  if (ncomps <= MAX_COMPS_IN_SCAN) {
    /* Single interleaved DC scan */
    scanptr->comps_in_scan = ncomps;
    for (ci = 0; ci < ncomps; ci++)
      scanptr->component_index[ci] = ci;
    scanptr->Ss = scanptr->Se = 0;
    scanptr->Ah = Ah;
    scanptr->Al = Al;
    scanptr++;
  } else {
    /* Noninterleaved DC scan for each component */
    scanptr = fill_scans(scanptr, ncomps, 0, 0, Ah, Al);
  }
  return scanptr;
}